

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTranslator_*>::relocate
          (QArrayDataPointer<QTranslator_*> *this,qsizetype offset,QTranslator ***data)

{
  bool bVar1;
  QTranslator **first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QTranslator **res;
  
  first = (QTranslator **)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<QTranslator*,long_long>(first,in_RDI,(QTranslator **)0x350587);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QTranslator*>,QTranslator*const*>
                        (data,(QArrayDataPointer<QTranslator_*> *)res), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(QTranslator ***)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }